

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::CreateLocalGenerators(cmGlobalGenerator *this)

{
  LocalGeneratorVector *this_00;
  pointer puVar1;
  pointer puVar2;
  _Head_base<0UL,_cmLocalGenerator_*,_false> local_30;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->LocalGeneratorSearchIndex)._M_h);
  this_00 = &this->LocalGenerators;
  std::
  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  ::clear(this_00);
  std::
  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  ::reserve(this_00,(long)(this->Makefiles).
                          super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->Makefiles).
                          super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->Makefiles).
                super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (*this->_vptr_cmGlobalGenerator[2])
              (&local_30,this,
               (puVar2->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
               _M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
               super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
    IndexLocalGenerator(this,local_30._M_head_impl);
    std::
    vector<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>,std::allocator<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>>
    ::emplace_back<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>
              ((vector<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>,std::allocator<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>>
                *)this_00,
               (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)&local_30);
    if (local_30._M_head_impl != (cmLocalGenerator *)0x0) {
      (*(local_30._M_head_impl)->_vptr_cmLocalGenerator[1])();
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateLocalGenerators()
{
  this->LocalGeneratorSearchIndex.clear();
  this->LocalGenerators.clear();
  this->LocalGenerators.reserve(this->Makefiles.size());
  for (const auto& m : this->Makefiles) {
    auto lg = this->CreateLocalGenerator(m.get());
    this->IndexLocalGenerator(lg.get());
    this->LocalGenerators.push_back(std::move(lg));
  }
}